

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall
Clasp::SharedMinimizeData::setMode
          (SharedMinimizeData *this,MinimizeMode m,wsum_t *bound,uint32 boundSize)

{
  uint uVar1;
  long lVar2;
  pointer plVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  this->mode_ = m;
  if (bound != (wsum_t *)0x0 && boundSize != 0) {
    LOCK();
    (this->gCount_).super___atomic_base<unsigned_int>._M_i = 0;
    UNLOCK();
    this->optGen_ = 0;
    uVar1 = (this->adjust_).ebo_.size;
    if (uVar1 < boundSize) {
      boundSize = uVar1;
    }
    bVar9 = uVar1 == 0;
    if (!bVar9) {
      uVar7 = 0;
      bVar4 = false;
      do {
        lVar2 = (this->adjust_).ebo_.buf[uVar7];
        lVar8 = bound[uVar7] - lVar2;
        lVar6 = 0x7fffffffffffffff;
        if (bound[uVar7] <= lVar2 + 0x7fffffffffffffff) {
          lVar6 = lVar8;
        }
        if (lVar2 < 0) {
          lVar8 = lVar6;
        }
        lVar2 = this->lower_[uVar7].super___atomic_base<long>._M_i;
        lVar6 = lVar8 - lVar2;
        if ((-1 < lVar6) || (bVar4)) {
          this->up_[0].ebo_.buf[uVar7] = lVar8;
          bVar4 = (bool)((lVar8 != lVar2 && -1 < lVar6) | bVar4);
          bVar5 = true;
        }
        else {
          bVar5 = false;
        }
        if (!bVar5) goto LAB_0015097d;
        uVar7 = uVar7 + 1;
        bVar9 = boundSize == uVar7;
      } while (!bVar9);
    }
    uVar1 = this->up_[0].ebo_.size;
    if (boundSize != uVar1) {
      plVar3 = this->up_[0].ebo_.buf;
      do {
        plVar3[boundSize] = 0x7fffffffffffffff;
        boundSize = boundSize + 1;
      } while (uVar1 != boundSize);
    }
LAB_0015097d:
    if (!bVar9) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SharedMinimizeData::setMode(MinimizeMode m, const wsum_t* bound, uint32 boundSize)  {
	mode_ = m;
	if (boundSize && bound) {
		SumVec& opt = up_[0];
		bool    ok  = false;
		gCount_     = 0;
		optGen_     = 0;
		boundSize   = std::min(boundSize, numRules());
		for (uint32 i = 0, end = boundSize; i != end; ++i) {
			wsum_t B = bound[i], a = adjust(i);
			B        = a >= 0 || (maxBound() + a) >= B ? B - a : maxBound();
			wsum_t d = B - lower_[i];
			if (d < 0 && !ok) { return false; }
			opt[i]   = B;
			ok       = ok || d > 0;
		}
		for (uint32 i = boundSize, end = (uint32)opt.size(); i != end; ++i) { opt[i] = maxBound(); }
	}
	return true;
}